

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::ProcessBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid)

{
  uint256 *this_00;
  bool bVar1;
  CNodeState *pCVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  base_uint<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = State(this,nodeid);
  if (pCVar2 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5bf,
                  "void (anonymous namespace)::PeerManagerImpl::ProcessBlockAvailability(NodeId)");
  }
  this_00 = &pCVar2->hashLastUnknownBlock;
  bVar1 = base_blob<256U>::IsNull(&this_00->super_base_blob<256U>);
  if (bVar1) goto LAB_0073955c;
  pCVar3 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,this_00);
  if (pCVar3 == (CBlockIndex *)0x0) goto LAB_0073955c;
  base_uint<256U>::base_uint(&local_50,0);
  bVar1 = operator>(&(pCVar3->nChainWork).super_base_uint<256U>,&local_50);
  if (!bVar1) goto LAB_0073955c;
  if (pCVar2->pindexBestKnownBlock == (CBlockIndex *)0x0) {
LAB_00739551:
    pCVar2->pindexBestKnownBlock = pCVar3;
  }
  else {
    bVar1 = operator>=(&(pCVar3->nChainWork).super_base_uint<256U>,
                       &(pCVar2->pindexBestKnownBlock->nChainWork).super_base_uint<256U>);
    if (bVar1) goto LAB_00739551;
  }
  base_blob<256U>::SetNull(&this_00->super_base_blob<256U>);
LAB_0073955c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessBlockAvailability(NodeId nodeid) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (!state->hashLastUnknownBlock.IsNull()) {
        const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(state->hashLastUnknownBlock);
        if (pindex && pindex->nChainWork > 0) {
            if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
                state->pindexBestKnownBlock = pindex;
            }
            state->hashLastUnknownBlock.SetNull();
        }
    }
}